

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::
BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
::overlaps<int,false,std::allocator<unsigned_long>>
          (BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>
           *this,View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  bool local_19;
  View<int,_false,_std::allocator<unsigned_long>_> *v_local;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  *this_local;
  
  bVar1 = View<short,false,std::allocator<unsigned_long>>::
          overlaps<int,false,std::allocator<unsigned_long>>
                    (*(View<short,false,std::allocator<unsigned_long>> **)this,v);
  local_19 = true;
  if (!bVar1) {
    local_19 = View<short,false,std::allocator<unsigned_long>>::
               overlaps<int,false,std::allocator<unsigned_long>>
                         (*(View<short,false,std::allocator<unsigned_long>> **)(this + 8),v);
  }
  return local_19;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e1_.overlaps(v) || e2_.overlaps(v); }